

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

double measure_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&),int>
                 (_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                  **solving_function,
                 matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                 *cost_matrix)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t row;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  DurationFormatter local_28;
  DurationFormatter local_20;
  
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = boost::chrono::steady_clock::now();
  (**solving_function)(cost_matrix,cost_matrix->size1_,cost_matrix->size2_,&assignment);
  lVar3 = boost::chrono::steady_clock::now();
  uVar4 = cost_matrix->size2_;
  if (cost_matrix->size2_ < cost_matrix->size1_) {
    uVar4 = cost_matrix->size1_;
  }
  local_50 = 1.0;
  for (uVar6 = 1; uVar6 <= uVar4; uVar6 = uVar6 + 1) {
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    local_50 = local_50 *
               ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"  Time to solve ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"x");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," assignment problem (");
  lVar1 = *(long *)poVar5;
  *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb;
  *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>(local_50);
  poVar5 = std::operator<<(poVar5," combinations): ");
  dVar7 = (double)(lVar3 - lVar2) / 1000000000.0;
  local_20.d_ = dVar7;
  poVar5 = operator<<(poVar5,&local_20);
  poVar5 = std::operator<<(poVar5," (");
  local_28.d_ = dVar7 / local_50;
  poVar5 = operator<<(poVar5,&local_28);
  poVar5 = std::operator<<(poVar5," per combination)");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return dVar7;
}

Assistant:

double measure_solver_timing(const SolvingFunction& solving_function, const ublas::matrix<Cost>& cost_matrix)
{
  typedef boost::chrono::high_resolution_clock Clock;
  std::vector<std::size_t> assignment;
  const Clock::time_point start_time(Clock::now());
  solving_function(cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment);
  const boost::chrono::duration<double> dt(Clock::now() - start_time);

  // Compute number of combinations = factorial of larger dimension of matrix:
  double c = 1;  // size_t gets too small fast
  for (std::size_t row = 1; row <= std::max(cost_matrix.size1(), cost_matrix.size2()); ++row)
  {
    c *= row;
  }

  std::cout << "  Time to solve " << cost_matrix.size1() << "x" << cost_matrix.size2() << " assignment problem ("
            << std::resetiosflags(std::ios::floatfield) << std::setprecision(8) << c << " combinations): "
            << DurationFormatter(dt.count()) << " (" << DurationFormatter(dt.count() / c) << " per combination)"
            << std::endl;
  return dt.count();
}